

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O2

int vfio_setup_interrupt(int device_fd)

{
  int iVar1;
  int *piVar2;
  __u32 _Var3;
  vfio_irq_info irq;
  char buf [512];
  
  fprintf(_stdout,"[INFO ] %s:%d %s(): Setup VFIO Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x97,
          "vfio_setup_interrupt");
  _Var3 = 2;
  while( true ) {
    if ((int)_Var3 < 0) {
      return -1;
    }
    irq.argsz = 0x10;
    irq.flags = 0;
    irq.count = 0;
    irq.index = _Var3;
    iVar1 = ioctl(device_fd,0x3b6d,&irq);
    if (iVar1 == -1) break;
    if ((irq._0_8_ & 0x100000000) != 0) {
      return _Var3;
    }
    fprintf(_stderr,"[DEBUG] %s:%d %s(): IRQ doesn\'t support Event FD\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
            0xa0,"vfio_setup_interrupt");
    _Var3 = _Var3 - 1;
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  __xpg_strerror_r(iVar1,buf,0x200);
  fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x9c,
          "vfio_setup_interrupt","get IRQ Info",buf);
  exit(iVar1);
}

Assistant:

int vfio_setup_interrupt(int device_fd) {
	info("Setup VFIO Interrupts");

	for (int i = VFIO_PCI_MSIX_IRQ_INDEX; i >= 0; i--) {
		struct vfio_irq_info irq = {.argsz = sizeof(irq), .index = i};

		check_err(ioctl(device_fd, VFIO_DEVICE_GET_IRQ_INFO, &irq), "get IRQ Info");

		/* if this vector cannot be used with eventfd continue with next*/
		if ((irq.flags & VFIO_IRQ_INFO_EVENTFD) == 0) {
			debug("IRQ doesn't support Event FD");
			continue;
		}

		return i;
	}

	return -1;
}